

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_req.cc
# Opt level: O3

int X509_REQ_add_extensions_nid(X509_REQ *req,stack_st_X509_EXTENSION *exts,int nid)

{
  int iVar1;
  uchar *ext;
  uchar *local_18;
  
  local_18 = (uchar *)0x0;
  iVar1 = ASN1_item_i2d((ASN1_VALUE *)exts,&local_18,(ASN1_ITEM *)&X509_EXTENSIONS_it);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  else {
    iVar1 = X509_REQ_add1_attr_by_NID(req,nid,0x10,local_18,iVar1);
    OPENSSL_free(local_18);
  }
  return iVar1;
}

Assistant:

int X509_REQ_add_extensions_nid(X509_REQ *req,
                                const STACK_OF(X509_EXTENSION) *exts, int nid) {
  // Generate encoding of extensions
  unsigned char *ext = NULL;
  int ext_len =
      ASN1_item_i2d((ASN1_VALUE *)exts, &ext, ASN1_ITEM_rptr(X509_EXTENSIONS));
  if (ext_len <= 0) {
    return 0;
  }
  int ret = X509_REQ_add1_attr_by_NID(req, nid, V_ASN1_SEQUENCE, ext, ext_len);
  OPENSSL_free(ext);
  return ret;
}